

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lifetime.h
# Opt level: O0

uint32 __thiscall Lifetime::GetRegionUseCount(Lifetime *this,Loop *loop)

{
  bool bVar1;
  Loop *loop_local;
  Lifetime *this_local;
  
  if ((loop != (Loop *)0x0) &&
     (bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,RegionUseCountPhase), !bVar1)) {
    if (this->regionUseCount != (uint32 *)0x0) {
      return this->regionUseCount[loop->loopNumber];
    }
    return 0;
  }
  return this->useCount;
}

Assistant:

uint32 GetRegionUseCount(Loop *loop)
    {
        if (loop && !PHASE_OFF1(Js::RegionUseCountPhase))
        {
            if (this->regionUseCount)
            {
                return this->regionUseCount[loop->loopNumber];
            }
            else
            {
                return 0;
            }
        }
        else
        {
            return this->useCount;
        }
    }